

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Str_t * Pdr_InvPrintStr(Vec_Int_t *vInv,Vec_Int_t *vCounts)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  void *__ptr;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  
  p = Vec_StrAlloc((int)vInv);
  p_00 = Pdr_InvMap(vCounts);
  iVar5 = vCounts->nSize;
  iVar2 = Vec_IntCountZero(vCounts);
  uVar6 = iVar5 - iVar2;
  piVar1 = vInv->pArray;
  __ptr = malloc((ulong)uVar6);
  uVar4 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar4;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined1 *)((long)__ptr + uVar4) = 0x2d;
  }
  piVar8 = piVar1 + 1;
  for (iVar5 = 0; iVar5 < *piVar1; iVar5 = iVar5 + 1) {
    for (lVar9 = 0; lVar9 < *piVar8; lVar9 = lVar9 + 1) {
      iVar2 = Abc_LitIsCompl(piVar8[lVar9 + 1]);
      iVar3 = Abc_Lit2Var(piVar8[lVar9 + 1]);
      iVar3 = Vec_IntEntry(p_00,iVar3);
      *(byte *)((long)__ptr + (long)iVar3) = (byte)iVar2 ^ 0x31;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      Vec_StrPush(p,*(char *)((long)__ptr + uVar4));
    }
    Vec_StrPush(p,' ');
    Vec_StrPush(p,'1');
    Vec_StrPush(p,'\n');
    for (lVar9 = 0; lVar9 < *piVar8; lVar9 = lVar9 + 1) {
      iVar2 = Abc_Lit2Var(piVar8[lVar9 + 1]);
      iVar2 = Vec_IntEntry(p_00,iVar2);
      *(undefined1 *)((long)__ptr + (long)iVar2) = 0x2d;
    }
    piVar8 = piVar8 + (long)*piVar8 + 1;
  }
  Vec_StrPush(p,'\0');
  free(__ptr);
  Vec_IntFree(p_00);
  return p;
}

Assistant:

Vec_Str_t * Pdr_InvPrintStr( Vec_Int_t * vInv, Vec_Int_t * vCounts )
{
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_Int_t * vMap = Pdr_InvMap( vCounts );
    int nVars = Vec_IntSize(vCounts) - Vec_IntCountZero(vCounts);
    int i, k, * pCube, * pList = Vec_IntArray(vInv);
    char * pBuffer = ABC_ALLOC( char, (size_t)(unsigned)nVars );
    for ( i = 0; i < nVars; i++ )
        pBuffer[i] = '-';
    Pdr_ForEachCube( pList, pCube, i )
    {
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '0' + !Abc_LitIsCompl(pCube[k+1]);
        for ( k = 0; k < nVars; k++ )
            Vec_StrPush( vStr, pBuffer[k] );
        Vec_StrPush( vStr, ' ' );
        Vec_StrPush( vStr, '1' );
        Vec_StrPush( vStr, '\n' );
        for ( k = 0; k < pCube[0]; k++ )
            pBuffer[Vec_IntEntry(vMap, Abc_Lit2Var(pCube[k+1]))] = '-';
    }
    Vec_StrPush( vStr, '\0' );
    ABC_FREE( pBuffer );
    Vec_IntFree( vMap );
    return vStr;
}